

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Maybe<kj::Promise<unsigned_long>_> * __thiscall
kj::anon_unknown_77::AsyncPipe::BlockedRead::tryPumpFrom
          (Maybe<kj::Promise<unsigned_long>_> *__return_storage_ptr__,BlockedRead *this,
          AsyncInputStream *input,uint64_t amount)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  ulong uVar2;
  void *pvVar3;
  Own<kj::_::ChainPromiseNode> OVar4;
  Own<kj::_::AdapterPromiseNode<unsigned_long,_kj::Canceler::AdapterImpl<unsigned_long>_>_> OVar5;
  Fault f_1;
  Fault f;
  Own<kj::_::PromiseNode> local_78;
  Promise<unsigned_long> local_68;
  Own<kj::_::PromiseNode> local_58;
  Fault local_48;
  undefined8 uStack_40;
  
  if ((this->canceler).list.ptr != (AdapterBase *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x2d0,FAILED,"canceler.isEmpty()","\"already pumping\"",
               (char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal(&local_48);
  }
  pvVar3 = (void *)(this->minBytes - this->readSoFar);
  if (this->readSoFar <= this->minBytes && pvVar3 != (void *)0x0) {
    if (amount < pvVar3) {
      pvVar3 = (void *)amount;
    }
    uVar2 = (this->readBuffer).size_;
    if (amount < uVar2) {
      uVar2 = amount;
    }
    (*input->_vptr_AsyncInputStream[1])(&local_58,input,(this->readBuffer).ptr,pvVar3,uVar2);
    this_00 = (TransformPromiseNodeBase *)operator_new(0x48);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_58,
               kj::_::
               TransformPromiseNode<kj::Promise<unsigned_long>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:727:17),_kj::_::PropagateException>
               ::anon_class_32_4_e1da9b0a_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00629f08;
    this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)this;
    this_00[1].dependency.disposer = (Disposer *)input;
    this_00[1].dependency.ptr = (PromiseNode *)amount;
    this_00[1].continuationTracePtr = pvVar3;
    local_78.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedRead::tryPumpFrom(kj::AsyncInputStream&,unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
          ::instance;
    local_78.ptr = (PromiseNode *)this_00;
    OVar4 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_48,&local_78);
    pPVar1 = local_78.ptr;
    local_68.super_PromiseBase.node.disposer._0_4_ = local_48.exception._0_4_;
    local_68.super_PromiseBase.node.disposer._4_4_ = local_48.exception._4_4_;
    local_68.super_PromiseBase.node.ptr = uStack_40;
    if ((TransformPromiseNodeBase *)local_78.ptr != (TransformPromiseNodeBase *)0x0) {
      local_78.ptr = (PromiseNode *)0x0;
      (**(local_78.disposer)->_vptr_Disposer)
                (local_78.disposer,
                 ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode,OVar4.ptr);
    }
    OVar5 = heap<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::Canceler&,kj::Promise<unsigned_long>>
                      ((kj *)&local_48,&this->canceler,&local_68);
    pPVar1 = local_68.super_PromiseBase.node.ptr;
    (__return_storage_ptr__->ptr).isSet = true;
    *(undefined4 *)&(__return_storage_ptr__->ptr).field_1 = local_48.exception._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 4) = local_48.exception._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = (undefined4)uStack_40;
    *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0xc) = uStack_40._4_4_;
    if (local_68.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
      local_68.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (*(code *)**(undefined8 **)
                  CONCAT44(local_68.super_PromiseBase.node.disposer._4_4_,
                           local_68.super_PromiseBase.node.disposer._0_4_))
                ((undefined8 *)
                 CONCAT44(local_68.super_PromiseBase.node.disposer._4_4_,
                          local_68.super_PromiseBase.node.disposer._0_4_),
                 pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode,OVar5.ptr);
    }
    pPVar1 = local_58.ptr;
    if (local_58.ptr != (PromiseNode *)0x0) {
      local_58.ptr = (PromiseNode *)0x0;
      (**(local_58.disposer)->_vptr_Disposer)
                (local_58.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode)
      ;
    }
    return __return_storage_ptr__;
  }
  local_78.disposer = (Disposer *)0x0;
  local_48.exception = (Exception *)0x0;
  uStack_40 = (PromiseNode *)0x0;
  kj::_::Debug::Fault::init
            ((Fault *)&local_78,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
            );
  kj::_::Debug::Fault::fatal((Fault *)&local_78);
}

Assistant:

KJ_IF_MAYBE(reason, stoppage) {
        if (reason->is<Eof>()) {
          return uint64_t(0);
        }
        return cp(reason->get<Exception>());
      }